

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EB2_IF_Torus.H
# Opt level: O2

Real __thiscall amrex::EB2::TorusIF::operator()(TorusIF *this,Real x,Real y,Real z)

{
  double dVar1;
  double dVar2;
  
  dVar1 = hypot(x - (this->m_center).x,y - (this->m_center).y);
  dVar1 = this->m_large_radius - dVar1;
  dVar2 = z - (this->m_center).z;
  return ((dVar1 * dVar1 + dVar2 * dVar2) - this->m_small_radius * this->m_small_radius) *
         this->m_sign;
}

Assistant:

AMREX_GPU_HOST_DEVICE inline
    Real operator() (AMREX_D_DECL(Real x, Real y, Real z)) const noexcept {
        Real d = std::hypot(x-m_center.x, y-m_center.y);
#if (AMREX_SPACEDIM == 2)
        return m_sign*((m_large_radius-d)*(m_large_radius-d)
                       - m_small_radius*m_small_radius);
#else
        return m_sign*((m_large_radius-d)*(m_large_radius-d)
                       +(z-m_center.z)*(z-m_center.z)
                       - m_small_radius*m_small_radius);
#endif
    }